

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O3

ByteMark * __thiscall DataBuffer::addMark(DataBuffer *this,String *name)

{
  iterator *piVar1;
  _Elt_pointer ppBVar2;
  ByteMark *pBVar3;
  ByteMark *mark;
  ByteMark *local_20;
  
  pBVar3 = (ByteMark *)operator_new(0x28);
  (pBVar3->name)._string._M_dataplus._M_p = (pointer)&(pBVar3->name)._string.field_2;
  (pBVar3->name)._string._M_string_length = 0;
  (pBVar3->name)._string.field_2._M_local_buf[0] = '\0';
  local_20 = pBVar3;
  std::__cxx11::string::_M_assign((string *)pBVar3);
  pBVar3->pos = *(int *)&this->m_position - *(int *)&this->m_buffer;
  ppBVar2 = (this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar2 ==
      (this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<ByteMark*,std::allocator<ByteMark*>>::_M_push_back_aux<ByteMark*const&>
              ((deque<ByteMark*,std::allocator<ByteMark*>> *)&this->m_marks,&local_20);
  }
  else {
    *ppBVar2 = pBVar3;
    piVar1 = &(this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
    local_20 = pBVar3;
  }
  return local_20;
}

Assistant:

ByteMark* DataBuffer::addMark (const String& name)
{
	ByteMark* mark = new ByteMark;
	mark->name = name;
	mark->pos = writtenSize();
	m_marks << mark;
	return mark;
}